

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::~IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  ~IfcCompositeProfileDef((IfcCompositeProfileDef *)&this[-1].super_IfcProfileDef.field_0x68);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}